

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::PReLUParameter::InternalSwap(PReLUParameter *this,PReLUParameter *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  FillerParameter *pFVar4;
  void *pvVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  void *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  pFVar4 = this->filler_;
  this->filler_ = other->filler_;
  other->filler_ = pFVar4;
  bVar1 = this->channel_shared_;
  this->channel_shared_ = other->channel_shared_;
  other->channel_shared_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar7 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar7 & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_00424ed8;
LAB_00424ec0:
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_00424ec0;
    pUVar9 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar7 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar7 & 1) == 0) {
    pUVar8 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe);
  }
  pvVar6 = pUVar8->fields_;
  pUVar8->fields_ = pUVar9->fields_;
  pUVar9->fields_ = pvVar6;
LAB_00424ed8:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void PReLUParameter::InternalSwap(PReLUParameter* other) {
  std::swap(filler_, other->filler_);
  std::swap(channel_shared_, other->channel_shared_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}